

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::WriteVoidElement(IMkvWriter *writer,uint64 size)

{
  int32 iVar1;
  int iVar2;
  uint64 uVar3;
  long lVar4;
  int64 stop_position;
  int32 i;
  uint8 value;
  int64 payload_position;
  uint64 void_size;
  uint64 void_entry_size;
  uint64 size_local;
  IMkvWriter *writer_local;
  
  if (writer == (IMkvWriter *)0x0) {
    writer_local = (IMkvWriter *)0x0;
  }
  else {
    void_entry_size = size;
    size_local = (uint64)writer;
    iVar1 = GetCodedUIntSize(size - 1);
    void_size = (size - 1) - (long)iVar1;
    uVar3 = EbmlMasterElementSize(0xec,void_size);
    payload_position = uVar3 + void_size;
    if (payload_position == void_entry_size) {
      _i = (**(code **)(*(long *)size_local + 8))();
      if (_i < 0) {
        writer_local = (IMkvWriter *)0x0;
      }
      else {
        iVar1 = WriteID((IMkvWriter *)size_local,0xec);
        if (iVar1 == 0) {
          iVar1 = WriteUInt((IMkvWriter *)size_local,void_size);
          if (iVar1 == 0) {
            stop_position._7_1_ = 0;
            for (stop_position._0_4_ = 0; (int)stop_position < (int)void_size;
                stop_position._0_4_ = (int)stop_position + 1) {
              iVar2 = (*(code *)**(undefined8 **)size_local)(size_local,(long)&stop_position + 7,1);
              if (iVar2 != 0) {
                return 0;
              }
            }
            lVar4 = (**(code **)(*(long *)size_local + 8))();
            if ((lVar4 < 0) || (lVar4 - _i != payload_position)) {
              writer_local = (IMkvWriter *)0x0;
            }
            else {
              writer_local = (IMkvWriter *)payload_position;
            }
          }
          else {
            writer_local = (IMkvWriter *)0x0;
          }
        }
        else {
          writer_local = (IMkvWriter *)0x0;
        }
      }
    }
    else {
      writer_local = (IMkvWriter *)0x0;
    }
  }
  return (uint64)writer_local;
}

Assistant:

uint64 WriteVoidElement(IMkvWriter* writer, uint64 size) {
  if (!writer)
    return false;

  // Subtract one for the void ID and the coded size.
  uint64 void_entry_size = size - 1 - GetCodedUIntSize(size - 1);
  uint64 void_size = EbmlMasterElementSize(libwebm::kMkvVoid, void_entry_size) +
                     void_entry_size;

  if (void_size != size)
    return 0;

  const int64 payload_position = writer->Position();
  if (payload_position < 0)
    return 0;

  if (WriteID(writer, libwebm::kMkvVoid))
    return 0;

  if (WriteUInt(writer, void_entry_size))
    return 0;

  const uint8 value = 0;
  for (int32 i = 0; i < static_cast<int32>(void_entry_size); ++i) {
    if (writer->Write(&value, 1))
      return 0;
  }

  const int64 stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64>(void_size))
    return 0;

  return void_size;
}